

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O2

int fits_get_token2(char **ptr,char *delimiter,char **token,int *isanumber,int *status)

{
  size_t sVar1;
  char *pcVar2;
  int *piVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  char *loc;
  char tval [73];
  
  iVar5 = 0;
  if (*status == 0) {
    pcVar6 = *ptr;
    while (*pcVar6 == ' ') {
      pcVar6 = pcVar6 + 1;
      *ptr = pcVar6;
    }
    sVar1 = strcspn(pcVar6,delimiter);
    iVar4 = (int)sVar1;
    iVar5 = 0;
    if (iVar4 != 0) {
      pcVar6 = (char *)calloc((long)((sVar1 << 0x20) + 0x100000000) >> 0x20,1);
      *token = pcVar6;
      if (pcVar6 == (char *)0x0) {
        ffpmsg("Couldn\'t allocate memory to hold token string (fits_get_token2).");
        *status = 0x71;
      }
      else {
        pcVar2 = *ptr;
        sVar1 = (long)(sVar1 << 0x20) >> 0x20;
        strncat(pcVar6,pcVar2,sVar1);
        *ptr = pcVar2 + sVar1;
        iVar5 = iVar4;
        if (isanumber != (int *)0x0) {
          *isanumber = 1;
          pcVar6 = *token;
          pcVar2 = strchr(pcVar6,0x44);
          if (pcVar2 != (char *)0x0) {
            strncpy(tval,pcVar6,0x48);
            tval[0x48] = '\0';
            loc = strchr(tval,0x44);
            if (loc != (char *)0x0) {
              *loc = 'E';
            }
            pcVar6 = tval;
          }
          strtod(pcVar6,&loc);
          if ((*loc & 0xdfU) != 0) {
            *isanumber = 0;
          }
          piVar3 = __errno_location();
          if (*piVar3 == 0x22) {
            *isanumber = 0;
          }
        }
      }
    }
  }
  return iVar5;
}

Assistant:

int fits_get_token2(char **ptr, 
                   char *delimiter,
                   char **token,
                   int *isanumber,  /* O - is this token a number? */
		   int *status)

/*
   parse off the next token, delimited by a character in 'delimiter',
   from the input ptr string;  increment *ptr to the end of the token.
   Returns the length of the token, not including the delimiter char;

   This routine allocates the *token string;  the calling routine must free it 
*/
{
    char *loc, tval[73];
    int slen;
    double dval;
    
    if (*status)
        return(0);
	
    while (**ptr == ' ')  /* skip over leading blanks */
        (*ptr)++;

    slen = strcspn(*ptr, delimiter);  /* length of next token */
    if (slen)
    {
	*token = (char *) calloc(slen + 1, 1); 
	if (!(*token)) {
          ffpmsg("Couldn't allocate memory to hold token string (fits_get_token2).");
          *status = MEMORY_ALLOCATION ;
	  return(0);
        }
 
        strncat(*token, *ptr, slen);       /* copy token */
        (*ptr) += slen;                   /* skip over the token */

        if (isanumber)  /* check if token is a number */
        {
            *isanumber = 1;

	    if (strchr(*token, 'D'))  {
	        strncpy(tval, *token, 72);
		tval[72] = '\0';

	        /*  The C language does not support a 'D'; replace with 'E' */
	        if ((loc = strchr(tval, 'D'))) *loc = 'E';

	        dval =  strtod(tval, &loc);
	    } else {
	        dval =  strtod(*token, &loc);
 	    }

	    /* check for read error, or junk following the value */
	    if (*loc != '\0' && *loc != ' ' ) *isanumber = 0;
	    if (errno == ERANGE) *isanumber = 0;
        }
    }

    return(slen);
}